

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O1

void __thiscall
ASDCP::DCData::SequenceParser::h__SequenceParser::h__SequenceParser(h__SequenceParser *this)

{
  this->m_FramesRead = 0;
  (this->m_PictureRate).Numerator = 0;
  (this->m_PictureRate).Denominator = 0;
  (this->m_FileList).
  super_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_FileList;
  (this->m_FileList).
  super_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_FileList;
  (this->m_FileList).
  super_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_FileList).m_DirName._M_dataplus._M_p = (pointer)&(this->m_FileList).m_DirName.field_2;
  (this->m_FileList).m_DirName._M_string_length = 0;
  (this->m_FileList).m_DirName.field_2._M_local_buf[0] = '\0';
  (this->m_CurrentFile)._M_node = (_List_node_base *)0x0;
  BytestreamParser::BytestreamParser(&this->m_Parser);
  (this->m_DDesc).EditRate.Numerator = 0;
  (this->m_DDesc).EditRate.Denominator = 0;
  (this->m_DDesc).ContainerDuration = 0;
  (this->m_DDesc).AssetID[0] = '\0';
  (this->m_DDesc).AssetID[1] = '\0';
  (this->m_DDesc).AssetID[2] = '\0';
  (this->m_DDesc).AssetID[3] = '\0';
  (this->m_DDesc).DataEssenceCoding[0] = '\0';
  (this->m_DDesc).DataEssenceCoding[1] = '\0';
  (this->m_DDesc).DataEssenceCoding[2] = '\0';
  (this->m_DDesc).DataEssenceCoding[3] = '\0';
  (this->m_DDesc).DataEssenceCoding[4] = '\0';
  (this->m_DDesc).DataEssenceCoding[5] = '\0';
  (this->m_DDesc).DataEssenceCoding[6] = '\0';
  (this->m_DDesc).DataEssenceCoding[7] = '\0';
  (this->m_DDesc).DataEssenceCoding[8] = '\0';
  (this->m_DDesc).DataEssenceCoding[9] = '\0';
  (this->m_DDesc).DataEssenceCoding[10] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xb] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xc] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xd] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xe] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xf] = '\0';
  (this->m_DDesc).AssetID[4] = '\0';
  (this->m_DDesc).AssetID[5] = '\0';
  (this->m_DDesc).AssetID[6] = '\0';
  (this->m_DDesc).AssetID[7] = '\0';
  (this->m_DDesc).AssetID[8] = '\0';
  (this->m_DDesc).AssetID[9] = '\0';
  (this->m_DDesc).AssetID[10] = '\0';
  (this->m_DDesc).AssetID[0xb] = '\0';
  *(undefined8 *)((this->m_DDesc).AssetID + 0xc) = 0;
  (this->m_DDesc).EditRate.Numerator = 0x18;
  (this->m_DDesc).EditRate.Denominator = 1;
  return;
}

Assistant:

h__SequenceParser() : m_FramesRead(0)
  {
    memset(&m_DDesc, 0, sizeof(m_DDesc));
    m_DDesc.EditRate = Rational(24,1);
  }